

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * chaiscript::json::JSONParser::parse_bool
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  bool bVar1;
  undefined1 uVar2;
  runtime_error *this;
  long lVar3;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = 4;
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  substr(&local_b0,str,*offset,4);
  bVar1 = std::operator==(&local_b0,"true");
  std::__cxx11::string::~string((string *)&local_b0);
  uVar2 = 1;
  if (!bVar1) {
    lVar3 = 5;
    Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    substr(&local_b0,str,*offset,5);
    bVar1 = std::operator==(&local_b0,"false");
    std::__cxx11::string::~string((string *)&local_b0);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"JSON ERROR: Bool: Expected \'true\' or \'false\', found \'",
                 &local_b1);
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::substr(&local_90,str,*offset,5);
      std::operator+(&local_50,&local_70,&local_90);
      std::operator+(&local_b0,&local_50,"\'");
      std::runtime_error::runtime_error(this,(string *)&local_b0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = 0;
  }
  *offset = *offset + lVar3;
  *(undefined1 *)
   &(__return_storage_ptr__->internal).d.
    super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
    .
    super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
       = uVar2;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x20) = '\x06';
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_bool(const std::string &str, size_t &offset) {
      if (str.substr(offset, 4) == "true") {
        offset += 4;
        return JSON(true);
      } else if (str.substr(offset, 5) == "false") {
        offset += 5;
        return JSON(false);
      } else {
        throw std::runtime_error(std::string("JSON ERROR: Bool: Expected 'true' or 'false', found '") + str.substr(offset, 5) + "'");
      }
    }